

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint128 CityHash128WithSeed(char *s,size_t len,uint128 seed)

{
  unsigned_long uVar1;
  uint64 uVar2;
  uint64 uVar3;
  uint64 uVar4;
  long lVar5;
  uint64 uVar6;
  uint64 local_e8;
  unsigned_long local_e0;
  pair<unsigned_long,_unsigned_long> local_d8;
  ulong local_c8;
  size_t tail_done;
  pair<unsigned_long,_unsigned_long> local_b0;
  pair<unsigned_long,_unsigned_long> local_a0;
  pair<unsigned_long,_unsigned_long> local_90;
  unsigned_long local_80;
  uint64 z;
  uint64 y;
  uint64 x;
  pair<unsigned_long,_unsigned_long> w;
  pair<unsigned_long,_unsigned_long> v;
  ulong local_38;
  size_t len_local;
  char *s_local;
  uint128 seed_local;
  
  seed_local.first = seed.second;
  s_local = (char *)seed.first;
  if (len < 0x80) {
    join_0x00000010_0x00000000_ = CityMurmur(s,len,seed);
  }
  else {
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
              ((pair<unsigned_long,_unsigned_long> *)&w.second);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
              ((pair<unsigned_long,_unsigned_long> *)&x);
    y = Uint128Low64((uint128 *)&s_local);
    z = Uint128High64((uint128 *)&s_local);
    local_80 = len * -0x4b6d499041670d8d;
    uVar2 = Rotate(z ^ 0xb492b66fbe98f273,0x31);
    uVar3 = Fetch64(s);
    w.second = uVar2 * -0x4b6d499041670d8d + uVar3;
    uVar2 = Rotate(w.second,0x2a);
    uVar3 = Fetch64(s + 8);
    uVar3 = uVar2 * -0x4b6d499041670d8d + uVar3;
    uVar4 = Rotate(z + local_80,0x23);
    uVar2 = y;
    x = uVar4 * -0x4b6d499041670d8d + y;
    uVar4 = Fetch64(s + 0x58);
    uVar2 = Rotate(uVar2 + uVar4,0x35);
    w.first = uVar2 * -0x4b6d499041670d8d;
    local_38 = len;
    len_local = (size_t)s;
    do {
      lVar5 = y + z + w.second;
      uVar2 = Fetch64((char *)(len_local + 8));
      uVar2 = Rotate(lVar5 + uVar2,0x25);
      y = uVar2 * -0x4b6d499041670d8d;
      lVar5 = z + uVar3;
      uVar2 = Fetch64((char *)(len_local + 0x30));
      uVar2 = Rotate(lVar5 + uVar2,0x2a);
      uVar1 = w.second;
      z = uVar2 * -0x4b6d499041670d8d;
      y = w.first ^ y;
      uVar2 = Fetch64((char *)(len_local + 0x28));
      z = uVar1 + uVar2 + z;
      uVar2 = Rotate(local_80 + x,0x21);
      local_80 = uVar2 * -0x4b6d499041670d8d;
      local_90 = WeakHashLen32WithSeeds((char *)len_local,uVar3 * -0x4b6d499041670d8d,y + x);
      std::pair<unsigned_long,_unsigned_long>::operator=
                ((pair<unsigned_long,_unsigned_long> *)&w.second,&local_90);
      uVar2 = z;
      uVar4 = local_80 + w.first;
      uVar6 = Fetch64((char *)(len_local + 0x10));
      local_a0 = WeakHashLen32WithSeeds((char *)(len_local + 0x20),uVar4,uVar2 + uVar6);
      std::pair<unsigned_long,_unsigned_long>::operator=
                ((pair<unsigned_long,_unsigned_long> *)&x,&local_a0);
      std::swap<unsigned_long>(&local_80,&y);
      lVar5 = y + z + w.second;
      uVar2 = Fetch64((char *)(len_local + 0x48));
      uVar2 = Rotate(lVar5 + uVar2,0x25);
      y = uVar2 * -0x4b6d499041670d8d;
      lVar5 = z + uVar3;
      uVar2 = Fetch64((char *)(len_local + 0x70));
      uVar2 = Rotate(lVar5 + uVar2,0x2a);
      uVar1 = w.second;
      z = uVar2 * -0x4b6d499041670d8d;
      y = w.first ^ y;
      uVar2 = Fetch64((char *)(len_local + 0x68));
      z = uVar1 + uVar2 + z;
      uVar2 = Rotate(local_80 + x,0x21);
      local_80 = uVar2 * -0x4b6d499041670d8d;
      local_b0 = WeakHashLen32WithSeeds
                           ((char *)(len_local + 0x40),uVar3 * -0x4b6d499041670d8d,y + x);
      std::pair<unsigned_long,_unsigned_long>::operator=
                ((pair<unsigned_long,_unsigned_long> *)&w.second,&local_b0);
      uVar2 = z;
      uVar4 = local_80 + w.first;
      uVar6 = Fetch64((char *)(len_local + 0x50));
      _tail_done = WeakHashLen32WithSeeds((char *)(len_local + 0x60),uVar4,uVar2 + uVar6);
      std::pair<unsigned_long,_unsigned_long>::operator=
                ((pair<unsigned_long,_unsigned_long> *)&x,(type)&tail_done);
      std::swap<unsigned_long>(&local_80,&y);
      len_local = len_local + 0x80;
      local_38 = local_38 - 0x80;
    } while (0x7f < local_38);
    uVar2 = Rotate(w.second + local_80,0x31);
    y = uVar2 * -0x3c5a37a36834ced9 + y;
    lVar5 = z * -0x3c5a37a36834ced9;
    uVar2 = Rotate(w.first,0x25);
    z = lVar5 + uVar2;
    lVar5 = local_80 * -0x3c5a37a36834ced9;
    uVar2 = Rotate(x,0x1b);
    local_80 = lVar5 + uVar2;
    x = x * 9;
    local_c8 = 0;
    while (w.second = w.second * -0x3c5a37a36834ced9, local_c8 < local_38) {
      local_c8 = local_c8 + 0x20;
      uVar2 = Rotate(y + z,0x2a);
      z = uVar2 * -0x3c5a37a36834ced9 + uVar3;
      uVar2 = Fetch64((char *)(((len_local + local_38) - local_c8) + 0x10));
      uVar1 = w.first;
      x = uVar2 + x;
      y = y * -0x3c5a37a36834ced9 + x;
      uVar2 = Fetch64((char *)((len_local + local_38) - local_c8));
      local_80 = uVar1 + uVar2 + local_80;
      w.first = w.second + w.first;
      local_d8 = WeakHashLen32WithSeeds
                           ((char *)((len_local + local_38) - local_c8),w.second + local_80,uVar3);
      std::pair<unsigned_long,_unsigned_long>::operator=
                ((pair<unsigned_long,_unsigned_long> *)&w.second,&local_d8);
    }
    y = HashLen16(y,w.second);
    z = HashLen16(z + local_80,x);
    uVar2 = HashLen16(y + uVar3,w.first);
    local_e0 = uVar2 + z;
    local_e8 = HashLen16(y + w.first,z + uVar3);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
              ((pair<unsigned_long,_unsigned_long> *)&seed_local.second,&local_e0,&local_e8);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

uint128 CityHash128WithSeed(const char *s, size_t len, uint128 seed) {
  if (len < 128) {
    return CityMurmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  pair<uint64, uint64> v, w;
  uint64 x = Uint128Low64(seed);
  uint64 y = Uint128High64(seed);
  uint64 z = len * k1;
  v.first = Rotate(y ^ k1, 49) * k1 + Fetch64(s);
  v.second = Rotate(v.first, 42) * k1 + Fetch64(s + 8);
  w.first = Rotate(y + z, 35) * k1 + x;
  w.second = Rotate(x + Fetch64(s + 88), 53) * k1;

  // This is the same inner loop as CityHash64(), manually unrolled.
  do {
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 128;
  } while (LIKELY(len >= 128));
  x += Rotate(v.first + z, 49) * k0;
  y = y * k0 + Rotate(w.second, 37);
  z = z * k0 + Rotate(w.first, 27);
  w.first *= 9;
  v.first *= k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (size_t tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = Rotate(x + y, 42) * k0 + v.second;
    w.first += Fetch64(s + len - tail_done + 16);
    x = x * k0 + w.first;
    z += w.second + Fetch64(s + len - tail_done);
    w.second += v.first;
    v = WeakHashLen32WithSeeds(s + len - tail_done, v.first + z, v.second);
    v.first *= k0;
  }
  // At this point our 56 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 56-byte-to-8-byte hashes to get a 16-byte final result.
  x = HashLen16(x, v.first);
  y = HashLen16(y + z, w.first);
  return uint128(HashLen16(x + v.second, w.second) + y,
                 HashLen16(x + w.second, y + v.second));
}